

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTags(Config *config)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pcVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar6;
  undefined4 extraout_var_01;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar7;
  pointer *ppPVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  pointer pbVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar13;
  string tagName;
  Text wrapper;
  string lcaseTagName;
  TestSpec testSpec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  ostringstream oss;
  undefined1 local_2d8 [32];
  Text local_2b8;
  undefined1 local_260 [32];
  TestSpec local_240;
  pointer local_228;
  pointer local_220;
  undefined1 local_218 [8];
  _Rb_tree_node_base _Stack_210;
  pointer local_1f0;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_1e0;
  undefined1 *local_1c8;
  size_type local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  char local_198 [8];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  local_170;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_158;
  TagAliasRegistry *local_140;
  ios_base local_138 [264];
  
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_240.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar5) == ((long *)CONCAT44(extraout_var_00,iVar5))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available tags:\n",0x14);
    TagAliasRegistry::get();
    local_190._8_8_ = 0;
    local_180._M_allocated_capacity._0_4_ = local_180._M_allocated_capacity._0_4_ & 0xffffff00;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140 = &TagAliasRegistry::get::instance;
    paVar2 = &local_2b8.str.field_2;
    local_2b8.str._M_dataplus._M_p = (pointer)paVar2;
    local_190._0_8_ = &local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"*","");
    this = TestSpecParser::parse((TestSpecParser *)local_1a8,&local_2b8.str);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2d8,&(this->m_testSpec).m_filters);
    _Stack_210._M_parent =
         (_Base_ptr)
         local_240.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    _Stack_210._0_8_ =
         local_240.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_218 = (undefined1  [8])
                local_240.m_filters.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_240.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2d8._0_8_;
    local_240.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_2d8._8_8_;
    local_240.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2d8._16_8_;
    local_2d8._0_8_ = (pointer)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_218);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.str._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b8.str._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_158);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tags for matching test cases:\n",0x1e);
  }
  _Stack_210._M_left = &_Stack_210;
  _Stack_210._0_8_ = _Stack_210._0_8_ & 0xffffffff00000000;
  _Stack_210._M_parent = (_Base_ptr)0x0;
  local_1f0 = (pointer)0x0;
  _Stack_210._M_right = _Stack_210._M_left;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x18))
                        ((long *)CONCAT44(extraout_var_01,iVar5),config);
  filterTests(&local_1e0,testCases,&local_240,(IConfig *)config);
  local_228 = local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_220 = local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      for (p_Var9 = ((local_1e0.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 !=
          &((local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
             .super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl.
           super__Rb_tree_header; p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        local_2d8._0_8_ = (pointer)(local_2d8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        toLower((string *)local_260,(string *)local_2d8);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                        *)local_218,(string *)local_260);
        if (iVar7._M_node == &_Stack_210) {
          local_2b8.str._M_string_length._0_4_ = 0;
          local_2b8.str.field_2._M_allocated_capacity = 0;
          local_2b8.str.field_2._8_8_ = &local_2b8.str._M_string_length;
          local_2b8.attr.indent = 0;
          local_2b8.attr.width = 0;
          local_1a8 = (undefined1  [8])local_198;
          local_2b8.attr.initialIndent = local_2b8.str.field_2._8_8_;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,local_260._0_8_,
                     (pointer)(local_260._0_8_ + local_260._8_8_));
          if (local_2b8.str.field_2._M_allocated_capacity == 0) {
            local_180._M_allocated_capacity._0_4_ = 0;
            local_180._8_8_ = 0;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_180;
            ppPVar8 = &local_170.
                       super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_170.
                 super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            local_180._M_allocated_capacity._0_4_ = (uint)local_2b8.str._M_string_length;
            local_180._8_8_ = local_2b8.str.field_2._M_allocated_capacity;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8.str.field_2._8_8_;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8.attr.initialIndent;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(local_2b8.str.field_2._M_allocated_capacity + 8) = &local_180;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8.attr.indent;
            local_2b8.str.field_2._M_allocated_capacity = 0;
            local_2b8.str.field_2._8_8_ = &local_2b8.str._M_string_length;
            ppPVar8 = (pointer *)&local_2b8.attr.indent;
            local_2b8.attr.initialIndent = local_2b8.str.field_2._8_8_;
          }
          *ppPVar8 = (pointer)0x0;
          vStack_158.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8.attr.width;
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                               *)local_218,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                               *)local_1a8);
          iVar7._M_node = (_Base_ptr)pVar13.first._M_node;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_190 + 8));
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_2b8);
        }
        iVar7._M_node[3]._M_left = (_Base_ptr)((long)&(iVar7._M_node[3]._M_left)->_M_color + 1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(iVar7._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_);
        }
        if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_);
        }
      }
      local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start = local_220 + 1;
    } while (local_1e0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
             .super__Vector_impl_data._M_start != local_228);
  }
  if (_Stack_210._M_left != &_Stack_210) {
    p_Var11 = _Stack_210._M_left;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      pcVar1 = local_198 + *(long *)((long)local_1a8 + -0x18);
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
      TagInfo::all_abi_cxx11_((string *)local_2d8,(TagInfo *)(p_Var11 + 2));
      local_260._16_8_ = 0x4f;
      local_260[0x18] = '\t';
      local_260._0_8_ = (pointer)0x0;
      local_260._8_8_ = 0;
      std::__cxx11::stringbuf::str();
      local_260._8_8_ = local_1c0;
      local_260._16_8_ = 0x46;
      Tbc::Text::Text(&local_2b8,(string *)local_2d8,(TextAttributes *)local_260);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_);
      }
      std::__cxx11::stringbuf::str();
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_2d8._0_8_,local_2d8._8_8_);
      pbVar3 = local_2b8.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = local_2b8.lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
          pbVar12 = pbVar12 + 1) {
        if (pbVar12 !=
            local_2b8.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b8.lines);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8.str._M_dataplus._M_p != &local_2b8.str.field_2) {
        operator_delete(local_2b8.str._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != &_Stack_210);
  }
  pcVar4 = local_1f0;
  paVar2 = &local_2b8.str.field_2;
  local_2b8.str._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"tag","");
  local_1a8 = (undefined1  [8])pcVar4;
  local_1a0._M_p = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_2b8.str._M_dataplus._M_p,
             local_2b8.str._M_dataplus._M_p +
             CONCAT44(local_2b8.str._M_string_length._4_4_,(uint)local_2b8.str._M_string_length));
  operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  if (local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_2b8.str._M_dataplus._M_p);
  }
  pcVar4 = local_1f0;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_1e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
               *)local_218);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_240.m_filters);
  return (size_t)pcVar4;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }